

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

PropertyIdArray * __thiscall
Js::FunctionBody::AllocatePropertyIdArrayForFormals
          (FunctionBody *this,uint32 size,uint32 count,byte extraSlots)

{
  Recycler *alloc;
  PropertyIdArray *propIdArray;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  data.typeinfo = (type_info *)(ulong)size;
  local_50 = (undefined1  [8])&PropertyIdArray::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_29f156b;
  data.filename._0_4_ = 0x19a0;
  alloc = Memory::Recycler::TrackAllocInfo
                    (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                     recycler,(TrackAllocData *)local_50);
  propIdArray = (PropertyIdArray *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
  propIdArray->count = count;
  propIdArray->extraSlots = extraSlots;
  propIdArray->hadDuplicates = false;
  propIdArray->has__proto__ = false;
  propIdArray->hasNonSimpleParams = false;
  SetFormalsPropIdArray(this,propIdArray);
  return propIdArray;
}

Assistant:

PropertyIdArray * FunctionBody::AllocatePropertyIdArrayForFormals(uint32 size, uint32 count, byte extraSlots)
    {
        //TODO: saravind: Should the allocation be a Leaf Allocation?
        PropertyIdArray * formalsPropIdArray = RecyclerNewPlus(GetScriptContext()->GetRecycler(), size, Js::PropertyIdArray, count, extraSlots);
        SetFormalsPropIdArray(formalsPropIdArray);
        return formalsPropIdArray;
    }